

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O0

bool __thiscall QHstsCache::isKnownHost(QHstsCache *this,QUrl *url)

{
  iterator __position;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  qsizetype qVar4;
  QStringView *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QStringView QVar5;
  qsizetype dot;
  bool superDomainMatch;
  iterator pos;
  HostName nameToTest;
  QString hostNameAsString;
  undefined4 in_stack_fffffffffffffed8;
  ComponentFormattingOption in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QHstsStore *this_00;
  QString *in_stack_fffffffffffffee8;
  QString *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  QStringView *in_stack_ffffffffffffff00;
  byte local_e9;
  qsizetype in_stack_ffffffffffffff18;
  QChar c;
  bool local_b1;
  Data *local_b0;
  QHstsPolicy *local_a8;
  QChar local_9a;
  _Base_ptr local_98;
  _Self local_90;
  _Self local_88 [3];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  QHstsStore local_58;
  undefined8 local_30;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QUrl::isValid();
  local_e9 = 1;
  if ((bVar1 & 1) != 0) {
    in_stack_ffffffffffffff00 = in_RSI;
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
    QUrl::host((QFlags_conflict *)local_20);
    bVar3 = is_valid_domain_name(in_stack_fffffffffffffef0);
    local_e9 = bVar3 ^ 0xff;
    QString::~QString((QString *)0x179b19);
  }
  if ((local_e9 & 1) == 0) {
    bVar3 = false;
    local_58.store = (QSettings)0xaa;
    local_58._25_7_ = 0xaaaaaaaaaaaaaa;
    local_58._32_8_ = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
    QUrl::host((QFlags_conflict *)&local_58.store);
    memset(&local_70,0,0x28);
    local_70 = 0xaaaaaaaaaaaaaaaa;
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58.observedPolicies.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.observedPolicies.d.ptr = (QHstsPolicy *)0xaaaaaaaaaaaaaaaa;
    QStringView::QStringView<QString,_true>(in_RSI,in_stack_fffffffffffffee8);
    QVar5.m_size._4_4_ = in_stack_fffffffffffffee4;
    QVar5.m_size._0_4_ = in_stack_fffffffffffffee0;
    QVar5.m_data = (storage_type_conflict *)in_stack_fffffffffffffee8;
    HostName::HostName((HostName *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       QVar5);
    this_00 = (QHstsStore *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
    while( true ) {
      c.ucs = (char16_t)((ulong)in_stack_ffffffffffffff18 >> 0x30);
      qVar4 = QStringView::size((QStringView *)&local_58);
      if (qVar4 == 0) break;
      local_88[0]._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
      local_88[0]._M_node =
           (_Base_ptr)
           std::
           map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
           ::find((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                   *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  (key_type *)0x179c70);
      local_90._M_node =
           (_Base_ptr)
           std::
           map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
           ::end((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                  *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar2 = std::operator!=(local_88,&local_90);
      if (bVar2) {
        std::_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>::operator->
                  ((_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_> *)
                   0x179cb5);
        bVar2 = QHstsPolicy::isExpired((QHstsPolicy *)CONCAT17(local_e9,in_stack_fffffffffffffef8));
        if (!bVar2) {
          if (bVar3) {
            std::_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_> *)
                       0x179d3f);
            bVar3 = QHstsPolicy::includesSubDomains((QHstsPolicy *)0x179d4b);
            if (!bVar3) goto LAB_00179d67;
          }
          local_b1 = true;
          goto LAB_00179e16;
        }
        local_98 = local_88[0]._M_node;
        __position._M_node._7_1_ = local_e9;
        __position._M_node._0_7_ = in_stack_fffffffffffffef8;
        std::
        map<QHstsCache::HostName,QHstsPolicy,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
        ::erase_abi_cxx11_((map<QHstsCache::HostName,_QHstsPolicy,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                            *)this_00,__position);
        if (*(long *)(in_RDI + 0x30) != 0) {
          in_stack_fffffffffffffee8 = *(QString **)(in_RDI + 0x30);
          std::_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>::operator->
                    ((_Rb_tree_iterator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_> *)
                     0x179d18);
          QHstsStore::addToObserved
                    (this_00,(QHstsPolicy *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        }
      }
LAB_00179d67:
      this_00 = &local_58;
      QChar::QChar<char16_t,_true>(&local_9a,L'.');
      in_stack_ffffffffffffff18 =
           QStringView::indexOf
                     (in_RSI,c,(qsizetype)in_stack_fffffffffffffee8,
                      (CaseSensitivity)((ulong)this_00 >> 0x20));
      if (in_stack_ffffffffffffff18 == -1) break;
      QVar5 = QStringView::mid((QStringView *)CONCAT17(local_e9,in_stack_fffffffffffffef8),in_RDI,
                               (qsizetype)in_stack_ffffffffffffff00);
      local_b0 = (Data *)QVar5.m_size;
      local_58.observedPolicies.d.d = local_b0;
      local_a8 = (QHstsPolicy *)QVar5.m_data;
      local_58.observedPolicies.d.ptr = local_a8;
      bVar3 = true;
    }
    local_b1 = false;
LAB_00179e16:
    HostName::~HostName((HostName *)0x179e23);
    QString::~QString((QString *)0x179e30);
  }
  else {
    local_b1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsCache::isKnownHost(const QUrl &url) const
{
    if (!url.isValid() || !is_valid_domain_name(url.host()))
        return false;

    /*
        RFC6797, 8.2.  Known HSTS Host Domain Name Matching

        * Superdomain Match
          If a label-for-label match between an entire Known HSTS Host's
          domain name and a right-hand portion of the given domain name
          is found, then this Known HSTS Host's domain name is a
          superdomain match for the given domain name.  There could be
          multiple superdomain matches for a given domain name.
        * Congruent Match
          If a label-for-label match between a Known HSTS Host's domain
          name and the given domain name is found -- i.e., there are no
          further labels to compare -- then the given domain name
          congruently matches this Known HSTS Host.

        We start from the congruent match, and then chop labels and dots and
        proceed with superdomain match. While RFC6797 recommends to start from
        superdomain, the result is the same - some valid policy will make a host
        known.
    */

    bool superDomainMatch = false;
    const QString hostNameAsString(url.host());
    HostName nameToTest(QStringView{hostNameAsString});
    while (nameToTest.fragment.size()) {
        auto const pos = knownHosts.find(nameToTest);
        if (pos != knownHosts.end()) {
            if (pos->second.isExpired()) {
                knownHosts.erase(pos);
#if QT_CONFIG(settings)
                if (hstsStore) {
                    // Inform our store that this policy has expired.
                    hstsStore->addToObserved(pos->second);
                }
#endif // QT_CONFIG(settings)
            } else if (!superDomainMatch || pos->second.includesSubDomains()) {
                return true;
            }
        }

        const qsizetype dot = nameToTest.fragment.indexOf(u'.');
        if (dot == -1)
            break;

        nameToTest.fragment = nameToTest.fragment.mid(dot + 1);
        superDomainMatch = true;
    }

    return false;
}